

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionScreenScroller::Drawer(DIntermissionScreenScroller *this)

{
  uint uVar1;
  uint uVar2;
  FTexture *this_00;
  FTexture *img;
  double local_58;
  double ypos2;
  double xpos2;
  double ypos1;
  double xpos1;
  int fheight;
  int fwidth;
  FTexture *tex2;
  FTexture *tex;
  DIntermissionScreenScroller *this_local;
  
  this_00 = FTextureManager::operator[](&TexMan,(FTextureID)(this->mFirstPic).texnum);
  img = FTextureManager::operator[](&TexMan,(FTextureID)(this->mSecondPic).texnum);
  if (((((this->super_DIntermissionScreen).mTicker < this->mScrollDelay) ||
       (this->mScrollDelay + this->mScrollTime <= (this->super_DIntermissionScreen).mTicker)) ||
      (this_00 == (FTexture *)0x0)) || (img == (FTexture *)0x0)) {
    DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
  }
  else {
    uVar1 = FTexture::GetScaledWidth(this_00);
    uVar2 = FTexture::GetScaledHeight(this_00);
    ypos1 = 0.0;
    xpos2 = 0.0;
    ypos2 = 0.0;
    local_58 = 0.0;
    switch(this->mScrollDir) {
    case 0:
    default:
      ypos1 = ((double)((this->super_DIntermissionScreen).mTicker - this->mScrollDelay) *
              (double)(int)uVar1) / (double)this->mScrollTime;
      ypos2 = ypos1 - (double)(int)uVar1;
      break;
    case 1:
      ypos1 = (-(double)((this->super_DIntermissionScreen).mTicker - this->mScrollDelay) *
              (double)(int)uVar1) / (double)this->mScrollTime;
      ypos2 = ypos1 + (double)(int)uVar1;
      break;
    case 2:
      xpos2 = ((double)((this->super_DIntermissionScreen).mTicker - this->mScrollDelay) *
              (double)(int)uVar2) / (double)this->mScrollTime;
      local_58 = xpos2 - (double)(int)uVar2;
      break;
    case 3:
      xpos2 = (-(double)((this->super_DIntermissionScreen).mTicker - this->mScrollDelay) *
              (double)(int)uVar2) / (double)this->mScrollTime;
      local_58 = xpos2 + (double)(int)uVar2;
    }
    DCanvas::DrawTexture
              ((DCanvas *)screen,this_00,ypos1,xpos2,0x40001399,(ulong)uVar1,0x4000139a,(ulong)uVar2
               ,0x400013a5,0,0);
    DCanvas::DrawTexture
              ((DCanvas *)screen,img,ypos2,local_58,0x40001399,(ulong)uVar1,0x4000139a,(ulong)uVar2,
               0x400013a5,0,0);
    DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
    (this->super_DIntermissionScreen).mBackground.texnum = (this->mSecondPic).texnum;
  }
  return;
}

Assistant:

void DIntermissionScreenScroller::Drawer ()
{
	FTexture *tex = TexMan[mFirstPic];
	FTexture *tex2 = TexMan[mSecondPic];
	if (mTicker >= mScrollDelay && mTicker < mScrollDelay + mScrollTime && tex != NULL && tex2 != NULL)
	{

		int fwidth = tex->GetScaledWidth();
		int fheight = tex->GetScaledHeight();

		double xpos1 = 0, ypos1 = 0, xpos2 = 0, ypos2 = 0;

		switch (mScrollDir)
		{
		case SCROLL_Up:
			ypos1 = double(mTicker - mScrollDelay) * fheight / mScrollTime;
			ypos2 = ypos1 - fheight;
			break;

		case SCROLL_Down:
			ypos1 = -double(mTicker - mScrollDelay) * fheight / mScrollTime;
			ypos2 = ypos1 + fheight;
			break;

		case SCROLL_Left:
		default:
			xpos1 = double(mTicker - mScrollDelay) * fwidth / mScrollTime;
			xpos2 = xpos1 - fwidth;
			break;

		case SCROLL_Right:
			xpos1 = -double(mTicker - mScrollDelay) * fwidth / mScrollTime;
			xpos2 = xpos1 + fwidth;
			break;
		}

		screen->DrawTexture (tex, xpos1, ypos1,
			DTA_VirtualWidth, fwidth,
			DTA_VirtualHeight, fheight,
			DTA_Masked, false,
			TAG_DONE);
		screen->DrawTexture (tex2, xpos2, ypos2,
			DTA_VirtualWidth, fwidth,
			DTA_VirtualHeight, fheight,
			DTA_Masked, false,
			TAG_DONE);

		screen->FillBorder (NULL);
		mBackground = mSecondPic;
	}
	else 
	{
		Super::Drawer();
	}
}